

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

void __thiscall ot::commissioner::coap::Message::SetToken(Message *this,uint8_t aTokenLength)

{
  uint8_t aTokenLength_local;
  Message *this_local;
  
  if (8 < aTokenLength) {
    abort();
  }
  *(byte *)&this->mHeader = *(byte *)&this->mHeader & 0xf | aTokenLength << 4;
  random::non_crypto::FillBuffer((this->mHeader).mToken,(ushort)aTokenLength);
  return;
}

Assistant:

void Message::SetToken(uint8_t aTokenLength)
{
    VerifyOrDie(aTokenLength <= sizeof(mHeader.mToken));

    mHeader.mTokenLength = aTokenLength;
    random::non_crypto::FillBuffer(mHeader.mToken, aTokenLength);
}